

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  bool bVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  size_t *psVar14;
  long lVar15;
  size_t sVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  undefined1 auVar40 [16];
  float fVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar45 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1e8;
  size_t local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined1 local_f8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined1 local_48 [16];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_188._8_4_ = 0x7f800000;
  local_188._0_8_ = 0x7f8000007f800000;
  local_188._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_198._8_4_ = 0xff800000;
  local_198._0_8_ = 0xff800000ff800000;
  local_198._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar21._8_8_ = 0;
  auVar21._0_4_ =
       (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.super_Geometry
       .time_range.lower;
  auVar21._4_4_ =
       (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.super_Geometry
       .time_range.upper;
  auVar28._8_8_ = 0;
  auVar28._0_4_ = time_range->lower;
  auVar28._4_4_ = time_range->upper;
  uVar12 = vcmpps_avx512vl(auVar21,auVar28,1);
  auVar20 = vinsertps_avx(auVar28,auVar21,0x50);
  auVar21 = vinsertps_avx(auVar21,auVar28,0x50);
  bVar6 = (bool)((byte)uVar12 & 1);
  local_b8._0_4_ = (float)((uint)bVar6 * auVar20._0_4_ | (uint)!bVar6 * auVar21._0_4_);
  bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
  local_b8._4_4_ = (uint)bVar6 * auVar20._4_4_ | (uint)!bVar6 * auVar21._4_4_;
  bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
  local_b8._8_4_ = (uint)bVar6 * auVar20._8_4_ | (uint)!bVar6 * auVar21._8_4_;
  bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
  local_b8._12_4_ = (uint)bVar6 * auVar20._12_4_ | (uint)!bVar6 * auVar21._12_4_;
  auVar48 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar49 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    uVar12 = r->_begin;
    if (uVar12 < r->_end) {
      local_1e8 = 0;
      auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar52 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar53 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar54 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      local_1b8._8_4_ = 0x7f800000;
      local_1b8._0_8_ = 0x7f8000007f800000;
      local_1b8._12_4_ = 0x7f800000;
      local_188._8_4_ = 0x7f800000;
      local_188._0_8_ = 0x7f8000007f800000;
      local_188._12_4_ = 0x7f800000;
      local_1a8._8_4_ = 0xff800000;
      local_1a8._0_8_ = 0xff800000ff800000;
      local_1a8._12_4_ = 0xff800000;
      local_198._8_4_ = 0xff800000;
      local_198._0_8_ = 0xff800000ff800000;
      local_198._12_4_ = 0xff800000;
      local_1c0 = k;
      do {
        BVar2 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar20._8_8_ = 0;
        auVar20._0_4_ = BVar2.lower;
        auVar20._4_4_ = BVar2.upper;
        auVar20 = vmovshdup_avx(auVar20);
        fVar24 = BVar2.lower;
        fVar34 = auVar48._0_4_ - fVar24;
        fVar23 = auVar20._0_4_ - fVar24;
        uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar12);
        pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 vertices.items;
        if ((ulong)(uVar3 + 3) < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                  super_Geometry.fnumTimeSegments;
          auVar21 = ZEXT416((uint)(fVar1 * (fVar34 / fVar23) * 1.0000002));
          auVar21 = vroundss_avx(auVar21,auVar21,9);
          auVar21 = vmaxss_avx(auVar50._0_16_,auVar21);
          auVar28 = ZEXT416((uint)(fVar1 * ((auVar49._0_4_ - fVar24) / fVar23) * 0.99999976));
          auVar28 = vroundss_avx(auVar28,auVar28,10);
          auVar28 = vminss_avx(auVar28,ZEXT416((uint)fVar1));
          if ((uint)(int)auVar21._0_4_ <= (uint)(int)auVar28._0_4_) {
            uVar11 = (ulong)(int)auVar21._0_4_;
            psVar14 = &pBVar4[uVar11].super_RawBufferView.stride;
            do {
              pcVar5 = ((RawBufferView *)(psVar14 + -2))->ptr_ofs;
              sVar16 = *psVar14;
              auVar51 = auVar52._0_16_;
              auVar21 = vandps_avx(auVar51,ZEXT416(*(uint *)(pcVar5 + sVar16 * uVar3 + 0xc)));
              if (1.844e+18 <= auVar21._0_4_) goto LAB_01ec6f22;
              lVar19 = sVar16 * (uVar3 + 1);
              auVar21 = vandps_avx(auVar51,ZEXT416(*(uint *)(pcVar5 + lVar19 + 0xc)));
              if (1.844e+18 <= auVar21._0_4_) goto LAB_01ec6f22;
              lVar18 = sVar16 * (uVar3 + 2);
              auVar21 = vandps_avx(auVar51,ZEXT416(*(uint *)(pcVar5 + lVar18 + 0xc)));
              if (1.844e+18 <= auVar21._0_4_) goto LAB_01ec6f22;
              lVar15 = sVar16 * (uVar3 + 3);
              auVar21 = vandps_avx(auVar51,ZEXT416(*(uint *)(pcVar5 + lVar15 + 0xc)));
              if (1.844e+18 <= auVar21._0_4_) goto LAB_01ec6f22;
              auVar21 = auVar53._0_16_;
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar3),auVar21,6);
              auVar51 = auVar54._0_16_;
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar3),auVar51,1);
              if ((~((ushort)uVar10 & (ushort)uVar9) & 7) != 0) goto LAB_01ec6f22;
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar19),auVar21,6);
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar19),auVar51,1);
              if ((~((ushort)uVar10 & (ushort)uVar9) & 7) != 0) goto LAB_01ec6f22;
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar21,6);
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar51,1);
              if ((~((ushort)uVar10 & (ushort)uVar9) & 7) != 0) goto LAB_01ec6f22;
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar15),auVar21,6);
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar15),auVar51,1);
              if ((~((ushort)uVar10 & (ushort)uVar9) & 7) != 0) goto LAB_01ec6f22;
              uVar11 = uVar11 + 1;
              psVar14 = psVar14 + 7;
            } while (uVar11 <= (ulong)(long)(int)auVar28._0_4_);
          }
          local_118.primID = &local_120;
          fVar22 = auVar20._0_4_ - fVar24;
          fVar34 = fVar34 / fVar22;
          fVar22 = (auVar49._0_4_ - fVar24) / fVar22;
          fVar23 = fVar1 * fVar34;
          fVar24 = fVar1 * fVar22;
          auVar28 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),9);
          auVar51 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
          auVar20 = vmaxss_avx(auVar28,auVar50._0_16_);
          auVar21 = vminss_avx(auVar51,ZEXT416((uint)fVar1));
          iVar13 = (int)auVar20._0_4_;
          fVar35 = auVar21._0_4_;
          uVar3 = (int)auVar28._0_4_;
          if ((int)auVar28._0_4_ < 0) {
            uVar3 = 0xffffffff;
          }
          iVar17 = (int)fVar1 + 1;
          if ((int)auVar51._0_4_ < (int)fVar1 + 1) {
            iVar17 = (int)auVar51._0_4_;
          }
          local_120 = uVar12;
          local_118.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar13);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar35);
          fVar23 = fVar23 - auVar20._0_4_;
          if (iVar17 - uVar3 == 1) {
            auVar20 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT816(0) << 0x40);
            auVar25._0_4_ = auVar20._0_4_;
            fVar34 = 1.0 - auVar25._0_4_;
            auVar25._4_4_ = auVar25._0_4_;
            auVar25._8_4_ = auVar25._0_4_;
            auVar25._12_4_ = auVar25._0_4_;
            auVar55._0_4_ = auVar25._0_4_ * local_108.m128[0];
            auVar55._4_4_ = auVar25._0_4_ * local_108.m128[1];
            auVar55._8_4_ = auVar25._0_4_ * local_108.m128[2];
            auVar55._12_4_ = auVar25._0_4_ * local_108.m128[3];
            auVar29._4_4_ = fVar34;
            auVar29._0_4_ = fVar34;
            auVar29._8_4_ = fVar34;
            auVar29._12_4_ = fVar34;
            auVar51 = vfmadd231ps_fma(auVar55,auVar29,(undefined1  [16])local_e8);
            auVar20 = vmulps_avx512vl(auVar25,local_f8);
            auVar21 = vfmadd231ps_avx512vl(auVar20,local_d8,auVar29);
            auVar20 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar24)),ZEXT816(0) << 0x40);
            fVar23 = auVar20._0_4_;
            fVar34 = 1.0 - fVar23;
            auVar38._0_4_ = fVar23 * local_e8.m128[0];
            auVar38._4_4_ = fVar23 * local_e8.m128[1];
            auVar38._8_4_ = fVar23 * local_e8.m128[2];
            auVar38._12_4_ = fVar23 * local_e8.m128[3];
            auVar30._4_4_ = fVar34;
            auVar30._0_4_ = fVar34;
            auVar30._8_4_ = fVar34;
            auVar30._12_4_ = fVar34;
            auVar40 = vfmadd231ps_fma(auVar38,auVar30,(undefined1  [16])local_108);
            auVar43._0_4_ = fVar23 * local_d8._0_4_;
            auVar43._4_4_ = fVar23 * local_d8._4_4_;
            auVar43._8_4_ = fVar23 * local_d8._8_4_;
            auVar43._12_4_ = fVar23 * local_d8._12_4_;
            auVar45 = vfmadd231ps_fma(auVar43,auVar30,local_f8);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar13 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar35 + -1));
            auVar20 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT816(0) << 0x40);
            fVar23 = auVar20._0_4_;
            auVar31._4_4_ = fVar23;
            auVar31._0_4_ = fVar23;
            auVar31._8_4_ = fVar23;
            auVar31._12_4_ = fVar23;
            auVar56._0_4_ = fVar23 * local_58.m128[0];
            auVar56._4_4_ = fVar23 * local_58.m128[1];
            auVar56._8_4_ = fVar23 * local_58.m128[2];
            auVar56._12_4_ = fVar23 * local_58.m128[3];
            fVar23 = 1.0 - fVar23;
            auVar26._4_4_ = fVar23;
            auVar26._0_4_ = fVar23;
            auVar26._8_4_ = fVar23;
            auVar26._12_4_ = fVar23;
            auVar51 = vfmadd231ps_fma(auVar56,auVar26,(undefined1  [16])local_e8);
            auVar20 = vmulps_avx512vl(auVar31,local_48);
            auVar21 = vfmadd231ps_avx512vl(auVar20,auVar26,local_d8);
            auVar20 = vmaxss_avx(ZEXT416((uint)(fVar35 - fVar24)),ZEXT816(0) << 0x40);
            fVar24 = auVar20._0_4_;
            fVar23 = 1.0 - fVar24;
            auVar39._0_4_ = fVar24 * local_78.m128[0];
            auVar39._4_4_ = fVar24 * local_78.m128[1];
            auVar39._8_4_ = fVar24 * local_78.m128[2];
            auVar39._12_4_ = fVar24 * local_78.m128[3];
            auVar32._4_4_ = fVar23;
            auVar32._0_4_ = fVar23;
            auVar32._8_4_ = fVar23;
            auVar32._12_4_ = fVar23;
            auVar40 = vfmadd231ps_fma(auVar39,auVar32,(undefined1  [16])local_108);
            auVar44._0_4_ = fVar24 * local_68;
            auVar44._4_4_ = fVar24 * fStack_64;
            auVar44._8_4_ = fVar24 * fStack_60;
            auVar44._12_4_ = fVar24 * fStack_5c;
            auVar45 = vfmadd231ps_fma(auVar44,auVar32,local_f8);
            if ((int)(uVar3 + 1) < iVar17) {
              sVar16 = (size_t)(uVar3 + 1);
              iVar17 = ~uVar3 + iVar17;
              do {
                fVar24 = ((float)(int)sVar16 / fVar1 - fVar34) / (fVar22 - fVar34);
                fVar23 = 1.0 - fVar24;
                auVar36._0_4_ = auVar40._0_4_ * fVar24;
                fVar35 = auVar40._4_4_;
                auVar36._4_4_ = fVar35 * fVar24;
                fVar41 = auVar40._8_4_;
                auVar36._8_4_ = fVar41 * fVar24;
                fVar42 = auVar40._12_4_;
                auVar36._12_4_ = fVar42 * fVar24;
                auVar33._4_4_ = fVar23;
                auVar33._0_4_ = fVar23;
                auVar33._8_4_ = fVar23;
                auVar33._12_4_ = fVar23;
                auVar20 = vfmadd231ps_fma(auVar36,auVar33,auVar51);
                auVar27._0_4_ = auVar45._0_4_ * fVar24;
                fVar23 = auVar45._4_4_;
                auVar27._4_4_ = fVar23 * fVar24;
                fVar46 = auVar45._8_4_;
                auVar27._8_4_ = fVar46 * fVar24;
                fVar47 = auVar45._12_4_;
                auVar27._12_4_ = fVar47 * fVar24;
                local_a8 = vfmadd231ps_avx512vl(auVar27,auVar21,auVar33);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,sVar16);
                local_168 = auVar51._0_4_;
                fStack_164 = auVar51._4_4_;
                fStack_160 = auVar51._8_4_;
                fStack_15c = auVar51._12_4_;
                auVar20 = vsubps_avx((undefined1  [16])local_98,auVar20);
                auVar51 = vsubps_avx(local_88,local_a8);
                auVar28 = vminps_avx(auVar20,ZEXT816(0) << 0x40);
                auVar20 = vmaxps_avx(auVar51,ZEXT816(0) << 0x40);
                auVar51._0_4_ = local_168 + auVar28._0_4_;
                auVar51._4_4_ = fStack_164 + auVar28._4_4_;
                auVar51._8_4_ = fStack_160 + auVar28._8_4_;
                auVar51._12_4_ = fStack_15c + auVar28._12_4_;
                auVar40._0_4_ = auVar40._0_4_ + auVar28._0_4_;
                auVar40._4_4_ = fVar35 + auVar28._4_4_;
                auVar40._8_4_ = fVar41 + auVar28._8_4_;
                auVar40._12_4_ = fVar42 + auVar28._12_4_;
                auVar21 = vaddps_avx512vl(auVar21,auVar20);
                auVar45._0_4_ = auVar45._0_4_ + auVar20._0_4_;
                auVar45._4_4_ = fVar23 + auVar20._4_4_;
                auVar45._8_4_ = fVar46 + auVar20._8_4_;
                auVar45._12_4_ = fVar47 + auVar20._12_4_;
                sVar16 = sVar16 + 1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
          }
          auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar10 = vcmpps_avx512vl(auVar51,auVar21,2);
          auVar48 = ZEXT1664(local_b8);
          auVar49 = ZEXT1664(local_c8);
          auVar52 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar53 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar54 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if (((~(ushort)uVar10 & 7) == 0) &&
             (uVar10 = vcmpps_avx512vl(auVar40,auVar45,2), (~(ushort)uVar10 & 7) == 0)) {
            auVar20 = vminps_avx(auVar51,auVar40);
            aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar20,ZEXT416(geomID),0x30);
            auVar20 = vmaxps_avx512vl(auVar21,auVar45);
            aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar20,ZEXT416((uint)uVar12),0x30);
            auVar37._0_4_ = aVar7.x + aVar8.x;
            auVar37._4_4_ = aVar7.y + aVar8.y;
            auVar37._8_4_ = aVar7.z + aVar8.z;
            auVar37._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
            local_1b8 = vminps_avx(local_1b8,(undefined1  [16])aVar7);
            local_1a8 = vmaxps_avx(local_1a8,(undefined1  [16])aVar8);
            local_188 = vminps_avx(local_188,auVar37);
            local_198 = vmaxps_avx(local_198,auVar37);
            local_1e8 = local_1e8 + 1;
            prims[local_1c0].lower.field_0.field_1 = aVar7;
            prims[local_1c0].upper.field_0.field_1 = aVar8;
            local_1c0 = local_1c0 + 1;
          }
        }
LAB_01ec6f22:
        uVar12 = uVar12 + 1;
      } while (uVar12 < r->_end);
    }
    else {
      local_1e8 = 0;
      local_1a8._8_4_ = 0xff800000;
      local_1a8._0_8_ = 0xff800000ff800000;
      local_1a8._12_4_ = 0xff800000;
      local_1b8._8_4_ = 0x7f800000;
      local_1b8._0_8_ = 0x7f8000007f800000;
      local_1b8._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_1b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_1b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_1a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_1a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1e8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }